

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * __thiscall
units::dimensions_abi_cxx11_(string *__return_storage_ptr__,units *this,precise_unit *units)

{
  bool bVar1;
  int iVar2;
  allocator local_aa;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  const_iterator local_68;
  value_type *mt;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<const_char_*,_units::precise_unit>,_251UL> *__range1;
  undefined1 local_40 [8];
  precise_unit base;
  allocator local_19;
  precise_unit *local_18;
  precise_unit *units_local;
  
  local_18 = (precise_unit *)this;
  units_local = (precise_unit *)__return_storage_ptr__;
  bVar1 = precise_unit::is_per_unit((precise_unit *)this);
  if ((!bVar1) && (iVar2 = precise_unit::unit_type_count(local_18), iVar2 != 0)) {
    __range1._4_4_ = precise_unit::base_units(local_18);
    precise_unit::precise_unit((precise_unit *)local_40,1.0,(unit_data *)((long)&__range1 + 4));
    __begin1 = (const_iterator)defined_measurement_types;
    __end1 = std::array<std::pair<const_char_*,_units::precise_unit>,_251UL>::begin
                       ((array<std::pair<const_char_*,_units::precise_unit>,_251UL> *)
                        defined_measurement_types);
    mt = std::array<std::pair<const_char_*,_units::precise_unit>,_251UL>::end
                   ((array<std::pair<const_char_*,_units::precise_unit>,_251UL> *)
                    defined_measurement_types);
    while( true ) {
      if (__end1 == mt) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"[unknown]",&local_aa);
        std::allocator<char>::~allocator((allocator<char> *)&local_aa);
        return __return_storage_ptr__;
      }
      local_68 = __end1;
      bVar1 = precise_unit::operator==((precise_unit *)local_40,&__end1->second);
      if (bVar1) break;
      __end1 = __end1 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,"[",&local_a9);
    std::operator+(&local_88,&local_a8,local_68->first);
    std::operator+(__return_storage_ptr__,&local_88,"]");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    return __return_storage_ptr__;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"[dimensionless]",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string dimensions(const precise_unit& units)
{
    if (units.is_per_unit() || units.unit_type_count() == 0) {
        return "[dimensionless]";
    }

    precise_unit base(1.0, units.base_units());
    for (const auto& mt : defined_measurement_types) {
        if (base == mt.second) {
            return std::string("[") + mt.first + "]";
        }
    }
    // Now it isn't something common so lets just build a sequence TODO(PT):
    return "[unknown]";
}